

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn_graph.h
# Opt level: O2

void __thiscall
gnns::Knn_Graph<L2Distance<float>_>::nth_index_element
          (Knn_Graph<L2Distance<float>_> *this,DistanceType *dist,size_t_conflict length,
          DistanceType *elements,IndexType *indices,size_t_conflict n)

{
  ulong uVar1;
  ulong uVar2;
  vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_> v;
  pair<float,_unsigned_int> local_50;
  _Vector_base<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>
  local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pair<float,_unsigned_int> *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pair<float,_unsigned_int> *)0x0;
  for (uVar1 = 0; length != uVar1; uVar1 = uVar1 + 1) {
    local_50.first = dist[uVar1];
    local_50.second = (uint)uVar1;
    std::vector<std::pair<float,unsigned_int>,std::allocator<std::pair<float,unsigned_int>>>::
    emplace_back<std::pair<float,unsigned_int>>
              ((vector<std::pair<float,unsigned_int>,std::allocator<std::pair<float,unsigned_int>>>
                *)&local_48,&local_50);
  }
  uVar2 = (ulong)n;
  std::
  nth_element<__gnu_cxx::__normal_iterator<std::pair<float,unsigned_int>*,std::vector<std::pair<float,unsigned_int>,std::allocator<std::pair<float,unsigned_int>>>>>
            ((__normal_iterator<std::pair<float,_unsigned_int>_*,_std::vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>_>
              )local_48._M_impl.super__Vector_impl_data._M_start,
             local_48._M_impl.super__Vector_impl_data._M_start + uVar2 + 1,
             (__normal_iterator<std::pair<float,_unsigned_int>_*,_std::vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>_>
              )local_48._M_impl.super__Vector_impl_data._M_finish);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<float,unsigned_int>*,std::vector<std::pair<float,unsigned_int>,std::allocator<std::pair<float,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_48._M_impl.super__Vector_impl_data._M_start,
             local_48._M_impl.super__Vector_impl_data._M_start + uVar2 + 1);
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    elements[uVar1] = local_48._M_impl.super__Vector_impl_data._M_start[uVar1 + 1].first;
    indices[uVar1] = local_48._M_impl.super__Vector_impl_data._M_start[uVar1 + 1].second;
  }
  std::
  _Vector_base<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_>::
  ~_Vector_base(&local_48);
  return;
}

Assistant:

void nth_index_element(DistanceType* dist, const size_t length, DistanceType* elements, IndexType* indices, const size_t n)
        {
            //construct a vector with index
            std::vector<std::pair<DistanceType, IndexType>> v;
            for(int i=0;i<length;++i)
                v.push_back(std::pair<DistanceType, size_t>(dist[i], i));

            //since it contain the point itself and find n+1 minimum elements
            std::nth_element(v.begin(), v.begin()+n+1, v.end());
            std::sort(v.begin(), v.begin()+n+1);
            //eliminate the first element(itself)
            for(size_t i=0;i<n;++i)
            {
                elements[i] = v[i+1].first;
                indices[i] = v[i+1].second;
            }
        }